

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SSLPending_Test::~SSLVersionTest_SSLPending_Test
          (SSLVersionTest_SSLPending_Test *this)

{
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_Test._vptr_Test = (_func_int **)&PTR__SSLVersionTest_00429750;
  (this->super_SSLVersionTest).super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&PTR__SSLVersionTest_00429790;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).key_);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).cert_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).client_ctx_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).server_ctx_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).server_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_SSLVersionTest).client_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SSLPending) {
  UniquePtr<SSL> ssl(SSL_new(client_ctx_.get()));
  ASSERT_TRUE(ssl);
  EXPECT_EQ(0, SSL_pending(ssl.get()));

  ASSERT_TRUE(Connect());
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  ASSERT_EQ(5, SSL_write(server_.get(), "hello", 5));
  ASSERT_EQ(5, SSL_write(server_.get(), "world", 5));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  char buf[10];
  ASSERT_EQ(1, SSL_peek(client_.get(), buf, 1));
  EXPECT_EQ(5, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(1, SSL_read(client_.get(), buf, 1));
  EXPECT_EQ(4, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(4, SSL_read(client_.get(), buf, 10));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  if (is_dtls()) {
    // In DTLS, the two records would have been read as a single datagram and
    // buffered inside |client_|. Thus, |SSL_has_pending| should return true.
    //
    // This test is slightly unrealistic. It relies on |ConnectClientAndServer|
    // using a |BIO| pair, which does not preserve datagram boundaries. Reading
    // 1 byte, then 4 bytes, from the first record also relies on
    // https://crbug.com/boringssl/65. But it does test the codepaths. When
    // fixing either of these bugs, this test may need to be redone.
    EXPECT_EQ(1, SSL_has_pending(client_.get()));
  } else {
    // In TLS, we do not overread, so |SSL_has_pending| should report no data is
    // buffered.
    EXPECT_EQ(0, SSL_has_pending(client_.get()));
  }

  ASSERT_EQ(2, SSL_read(client_.get(), buf, 2));
  EXPECT_EQ(3, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));
}